

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOption
          (Impl *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar1;
  function<void_()> local_50;
  
  std::function<void_()>::function
            (&local_50,(function<void_()> *)CONCAT71(in_register_00000009,required));
  addOptionCommon<std::function<void()>>
            (this,optionVariants,callback,SUB81(&local_50,0),
             (string *)((ulong)infoText & 0xffffffff));
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
         sVar1.
         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<OptionDefinition> addOption(const OptionSet & optionVariants, ValuelessCallback callback, bool required, const std::string & infoText)
    {
        return addOptionCommon(optionVariants, callback, required, infoText);
    }